

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

StringWTF8Advance * __thiscall
wasm::Builder::makeStringWTF8Advance
          (Builder *this,Expression *ref,Expression *pos,Expression *bytes)

{
  StringWTF8Advance *this_00;
  StringWTF8Advance *ret;
  Expression *bytes_local;
  Expression *pos_local;
  Expression *ref_local;
  Builder *this_local;
  
  this_00 = MixedArena::alloc<wasm::StringWTF8Advance>(&this->wasm->allocator);
  this_00->ref = ref;
  this_00->pos = pos;
  this_00->bytes = bytes;
  StringWTF8Advance::finalize(this_00);
  return this_00;
}

Assistant:

StringWTF8Advance*
  makeStringWTF8Advance(Expression* ref, Expression* pos, Expression* bytes) {
    auto* ret = wasm.allocator.alloc<StringWTF8Advance>();
    ret->ref = ref;
    ret->pos = pos;
    ret->bytes = bytes;
    ret->finalize();
    return ret;
  }